

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplingTexture.cpp
# Opt level: O0

string * __thiscall
glcts::TextureBorderClampSamplingTexture<unsigned_char,unsigned_char>::
getVertexShaderCode_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  GLenum GVar1;
  TestError *this_00;
  ostream *poVar2;
  string local_1e0 [8];
  string coordAssignment;
  string coordType;
  stringstream result;
  ostream local_190;
  void *local_18;
  TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *this_local;
  
  local_18 = this;
  this_local = (TextureBorderClampSamplingTexture<unsigned_char,_unsigned_char> *)
               __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)(coordType.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(coordAssignment.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_1e0);
  GVar1 = TestConfiguration<unsigned_char,_unsigned_char>::get_target
                    ((TestConfiguration<unsigned_char,_unsigned_char> *)((long)this + 0x2c8));
  if (GVar1 == 0xde1) {
    std::__cxx11::string::operator=((string *)(coordAssignment.field_2._M_local_buf + 8),"vec2");
    std::__cxx11::string::operator=(local_1e0,"texture_coords_in");
  }
  else {
    if ((GVar1 != 0x806f) && (GVar1 != 0x8c1a)) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not allowed texture target!","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampSamplingTexture.cpp"
                 ,0x37c);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    std::__cxx11::string::operator=((string *)(coordAssignment.field_2._M_local_buf + 8),"vec3");
    std::__cxx11::string::operator=(local_1e0,"vec3(texture_coords_in, layer)");
  }
  poVar2 = std::operator<<(&local_190,
                           "${VERSION}\n\nprecision highp float;\n\nlayout (location = 0) in vec4 vertex_position_in;\nlayout (location = 1) in vec2 texture_coords_in;\nout "
                          );
  poVar2 = std::operator<<(poVar2,(string *)(coordAssignment.field_2._M_local_buf + 8));
  poVar2 = std::operator<<(poVar2,
                           " texture_coords_out;\nuniform float layer;\n\nvoid main()\n{\n    gl_Position = vertex_position_in;\n    texture_coords_out = "
                          );
  poVar2 = std::operator<<(poVar2,local_1e0);
  std::operator<<(poVar2,";\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)(coordAssignment.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream((stringstream *)(coordType.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string TextureBorderClampSamplingTexture<InputType, OutputType>::getVertexShaderCode(void)
{
	std::stringstream result;
	std::string		  coordType;
	std::string		  coordAssignment;

	/* Check input texture target and prepare approperiate coordinate type and coordinate assignment method */
	switch (m_test_configuration.get_target())
	{
	case GL_TEXTURE_2D:
		coordType		= "vec2";
		coordAssignment = "texture_coords_in";
		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		coordType		= "vec3";
		coordAssignment = "vec3(texture_coords_in, layer)";
		break;

	default:
		throw tcu::TestError("Not allowed texture target!", "", __FILE__, __LINE__);
	}

	result << "${VERSION}\n"
			  "\n"
			  "precision highp float;\n"
			  "\n"
			  "layout (location = 0) in vec4 vertex_position_in;\n"
			  "layout (location = 1) in vec2 texture_coords_in;\n"
			  "out "
		   << coordType << " texture_coords_out;\n"
						   "uniform float layer;\n"
						   "\n"
						   "void main()\n"
						   "{\n"
						   "    gl_Position = vertex_position_in;\n"
						   "    texture_coords_out = "
		   << coordAssignment << ";\n"
								 "}\n";

	return result.str();
}